

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_path.c
# Opt level: O0

size_t portability_path_get_module_name
                 (char *path,size_t path_size,char *extension,size_t extension_size,char *name,
                 size_t name_size)

{
  size_t sVar1;
  ulong in_RCX;
  long in_RDX;
  ulong in_RSI;
  char *in_RDI;
  char *in_R8;
  size_t in_R9;
  size_t j;
  size_t i;
  long local_48;
  long local_40;
  size_t local_8;
  
  if (((in_RDI == (char *)0x0) || (in_RDX == 0)) || (in_R8 == (char *)0x0)) {
    local_8 = 0;
  }
  else if (in_RSI < in_RCX) {
    local_8 = portability_path_get_fullname(in_RDI,in_RSI,in_R8,in_R9);
  }
  else {
    local_48 = in_RSI - 1;
    for (local_40 = in_RCX - 1; local_40 != 0 && local_48 != 0; local_40 = local_40 + -1) {
      if (*(char *)(in_RDX + local_40) != in_RDI[local_48]) {
        sVar1 = portability_path_get_fullname(in_RDI,in_RSI,in_R8,in_R9);
        return sVar1;
      }
      local_48 = local_48 + -1;
    }
    local_8 = portability_path_get_name(in_RDI,in_RSI,in_R8,in_R9);
  }
  return local_8;
}

Assistant:

size_t portability_path_get_module_name(const char *path, size_t path_size, const char *extension, size_t extension_size, char *name, size_t name_size)
{
	if (path == NULL || extension == NULL || name == NULL)
	{
		return 0;
	}

	if (path_size < extension_size)
	{
		return portability_path_get_fullname(path, path_size, name, name_size);
	}

	size_t i, j;

	for (i = extension_size - 1, j = path_size - 1; i > 0 && j > 0; --i, --j)
	{
		if (extension[i] != path[j])
		{
			return portability_path_get_fullname(path, path_size, name, name_size);
		}
	}

	return portability_path_get_name(path, path_size, name, name_size);
}